

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_sse_harley_seal_improved(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 (*pauVar1) [16];
  size_t i;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 (*pauVar7) [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  uint16_t buffer [8];
  
  if ((len & 0x7f) != 0) {
    auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar18 = vpmovsxbd_avx512f(_DAT_00116080);
    auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar4 = (ulong)(len & 0xffffff80);
    do {
      uVar4 = uVar4 + 1;
      auVar20 = vpbroadcastd_avx512f();
      auVar20 = vpsrlvd_avx512f(auVar20,auVar18);
      auVar20 = vpandd_avx512f(auVar20,auVar19);
      auVar17 = vpaddd_avx512f(auVar20,auVar17);
    } while (uVar4 < len);
    auVar17 = vmovdqu64_avx512f(auVar17);
    *(undefined1 (*) [64])flags = auVar17;
  }
  uVar6 = len >> 3 & 0xfffffff0;
  uVar4 = (ulong)uVar6;
  if (uVar6 == 0) {
    auVar21 = (undefined1  [16])0x0;
    auVar23 = (undefined1  [16])0x0;
    auVar22 = (undefined1  [16])0x0;
    auVar24 = (undefined1  [16])0x0;
  }
  else {
    auVar21._8_2_ = 0x5555;
    auVar21._0_8_ = 0x5555555555555555;
    auVar21._10_2_ = 0x5555;
    auVar21._12_2_ = 0x5555;
    auVar21._14_2_ = 0x5555;
    auVar22._8_2_ = 0x3333;
    auVar22._0_8_ = 0x3333333333333333;
    auVar22._10_2_ = 0x3333;
    auVar22._12_2_ = 0x3333;
    auVar22._14_2_ = 0x3333;
    auVar23._8_2_ = 0x707;
    auVar23._0_8_ = 0x707070707070707;
    auVar23._10_2_ = 0x707;
    auVar23._12_2_ = 0x707;
    auVar23._14_2_ = 0x707;
    auVar24._8_4_ = 0xf;
    auVar24._0_8_ = 0xf0000000f;
    auVar24._12_4_ = 0xf;
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    auVar25 = ZEXT1664((undefined1  [16])0x0);
    auVar26 = ZEXT1664((undefined1  [16])0x0);
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    uVar2 = 0;
    do {
      auVar11 = auVar20._0_16_;
      auVar10 = auVar19._0_16_;
      auVar8 = auVar25._0_16_;
      auVar9 = auVar27._0_16_;
      uVar5 = uVar2 + 0xffff;
      if (uVar4 - uVar2 < 0x10000) {
        uVar5 = uVar4;
      }
      if (uVar2 < uVar5) {
        pauVar7 = (undefined1 (*) [16])(array + uVar2 * 8 + 0x78);
        do {
          auVar8 = vmovdqu64_avx512vl(pauVar7[-0xc]);
          uVar2 = uVar2 + 0x10;
          auVar9 = vpxorq_avx512vl(pauVar7[-0xf],auVar28._0_16_);
          auVar10 = vpandq_avx512vl(auVar9,pauVar7[-0xe]);
          auVar10 = vpternlogq_avx512vl(auVar10,pauVar7[-0xf],auVar28._0_16_,0xf8);
          auVar11 = vpxorq_avx512vl(auVar9,pauVar7[-0xe]);
          auVar9 = auVar11 ^ pauVar7[-0xd];
          auVar12 = vpandq_avx512vl(auVar9,auVar8);
          auVar11 = vpternlogq_avx512vl(auVar12,auVar11,pauVar7[-0xd],0xf8);
          auVar8 = vpxorq_avx512vl(auVar9,auVar8);
          auVar12 = vpxorq_avx512vl(auVar10,auVar26._0_16_);
          auVar9 = vpand_avx(auVar11,auVar12);
          auVar9 = vpternlogq_avx512vl(auVar9,auVar10,auVar26._0_16_,0xf8);
          auVar10 = vpxorq_avx512vl(auVar8,pauVar7[-0xb]);
          auVar13 = vpandq_avx512vl(auVar10,pauVar7[-10]);
          auVar8 = vpternlogq_avx512vl(auVar13,auVar8,pauVar7[-0xb],0xf8);
          auVar10 = vpxorq_avx512vl(auVar10,pauVar7[-10]);
          auVar13 = vpxorq_avx512vl(auVar10,pauVar7[-9]);
          auVar14 = vpandq_avx512vl(auVar13,pauVar7[-8]);
          auVar10 = vpternlogq_avx512vl(auVar14,auVar10,pauVar7[-9],0xf8);
          auVar14 = vpxorq_avx512vl(auVar8,auVar11 ^ auVar12);
          auVar13 = vpxorq_avx512vl(auVar13,pauVar7[-8]);
          auVar15 = vpxorq_avx512vl(auVar9,auVar18._0_16_);
          auVar16 = vpandq_avx512vl(auVar10,auVar14);
          auVar8 = vpternlogq_avx512vl(auVar16,auVar8,auVar11 ^ auVar12,0xf8);
          auVar10 = vpxorq_avx512vl(auVar10,auVar14);
          auVar11 = vpandq_avx512vl(auVar8,auVar15);
          auVar14 = vpternlogq_avx512vl(auVar11,auVar9,auVar18._0_16_,0xf8);
          auVar11 = vpxorq_avx512vl(auVar8,auVar15);
          auVar9 = vpxorq_avx512vl(auVar13,pauVar7[-7]);
          auVar8 = vpandq_avx512vl(auVar9,pauVar7[-6]);
          auVar8 = vpternlogq_avx512vl(auVar8,auVar13,pauVar7[-7],0xf8);
          auVar9 = vpxorq_avx512vl(auVar9,pauVar7[-6]);
          auVar12 = vpxorq_avx512vl(auVar9,pauVar7[-5]);
          auVar13 = vpandq_avx512vl(auVar12,pauVar7[-4]);
          auVar9 = vpternlogq_avx512vl(auVar13,auVar9,pauVar7[-5],0xf8);
          auVar13 = vpxorq_avx512vl(auVar8,auVar10);
          auVar12 = vpxorq_avx512vl(auVar12,pauVar7[-4]);
          auVar15 = vmovdqu64_avx512vl(pauVar7[-2]);
          auVar16 = vpandq_avx512vl(auVar9,auVar13);
          auVar16 = vpternlogq_avx512vl(auVar16,auVar8,auVar10,0xf8);
          auVar9 = vpxorq_avx512vl(auVar9,auVar13);
          auVar8 = vpxorq_avx512vl(auVar12,pauVar7[-3]);
          auVar10 = vpandq_avx512vl(auVar8,auVar15);
          auVar10 = vpternlogq_avx512vl(auVar10,auVar12,pauVar7[-3],0xf8);
          pauVar1 = pauVar7 + -1;
          auVar8 = vpxorq_avx512vl(auVar8,auVar15);
          auVar12 = vmovdqu64_avx512vl(*pauVar7);
          pauVar7 = pauVar7 + 0x10;
          auVar13 = vpxorq_avx512vl(auVar8,*pauVar1);
          auVar15 = vpandq_avx512vl(auVar13,auVar12);
          auVar8 = vpternlogq_avx512vl(auVar15,auVar8,*pauVar1,0xf8);
          auVar15 = vpxorq_avx512vl(auVar10,auVar9);
          auVar12 = vpxorq_avx512vl(auVar13,auVar12);
          auVar28 = ZEXT1664(auVar12);
          auVar12 = vpandq_avx512vl(auVar8,auVar15);
          auVar13 = vpternlogq_avx512vl(auVar12,auVar10,auVar9,0xf8);
          auVar9 = vpxorq_avx512vl(auVar8,auVar15);
          auVar26 = ZEXT1664(auVar9);
          auVar9 = vpandq_avx512vl(auVar13,auVar16 ^ auVar11);
          auVar15 = vpternlogq_avx512vl(auVar9,auVar16,auVar11,0xf8);
          auVar8 = vpsrld_avx(auVar29._0_16_,1);
          auVar9 = vpand_avx(auVar29._0_16_,auVar21);
          auVar12 = auVar14 ^ auVar17._0_16_;
          auVar8 = vpand_avx(auVar8,auVar21);
          auVar9 = vphaddw_avx(auVar9,auVar8);
          auVar8 = vpsrld_avx(auVar9,2);
          auVar9 = vpand_avx(auVar9,auVar22);
          auVar8 = vpand_avx(auVar8,auVar22);
          auVar9 = vphaddw_avx(auVar9,auVar8);
          auVar8 = vpsrld_avx(auVar9,4);
          auVar9 = vpand_avx(auVar9,auVar23);
          auVar8 = vpand_avx(auVar8,auVar23);
          auVar10 = vphaddw_avx(auVar9,auVar8);
          auVar9 = vpxorq_avx512vl(auVar13,auVar16 ^ auVar11);
          auVar18 = ZEXT1664(auVar9);
          auVar9 = vpand_avx(auVar10,auVar24);
          auVar9 = vpaddd_avx(auVar9,auVar27._0_16_);
          auVar27 = ZEXT1664(auVar9);
          auVar8 = vpsrld_avx(auVar10,8);
          auVar8 = vpand_avx(auVar8,auVar24);
          auVar8 = vpaddd_avx(auVar25._0_16_,auVar8);
          auVar25 = ZEXT1664(auVar8);
          auVar11 = vpsrld_avx(auVar10,0x10);
          auVar10 = vpsrld_avx(auVar10,0x18);
          auVar11 = vpand_avx(auVar11,auVar24);
          auVar10 = vpaddd_avx(auVar10,auVar19._0_16_);
          auVar19 = ZEXT1664(auVar10);
          auVar13 = vpandq_avx512vl(auVar15,auVar12);
          auVar13 = vpternlogq_avx512vl(auVar13,auVar14,auVar17._0_16_,0xf8);
          auVar29 = ZEXT1664(auVar13);
          auVar11 = vpaddd_avx(auVar11,auVar20._0_16_);
          auVar20 = ZEXT1664(auVar11);
          auVar12 = vpxorq_avx512vl(auVar15,auVar12);
          auVar17 = ZEXT1664(auVar12);
        } while (uVar2 < uVar5);
      }
      auVar13 = vpsrld_avx(auVar29._0_16_,1);
      auVar12 = vpand_avx(auVar29._0_16_,auVar21);
      auVar13 = vpand_avx(auVar13,auVar21);
      auVar12 = vphaddw_avx(auVar12,auVar13);
      auVar13 = vpsrld_avx(auVar12,2);
      auVar12 = vpand_avx(auVar12,auVar22);
      auVar13 = vpand_avx(auVar13,auVar22);
      auVar12 = vphaddw_avx(auVar12,auVar13);
      auVar13 = vpsrld_avx(auVar12,4);
      auVar12 = vpand_avx(auVar12,auVar23);
      auVar13 = vpand_avx(auVar13,auVar23);
      auVar13 = vphaddw_avx(auVar12,auVar13);
      auVar12 = vpand_avx(auVar13,auVar24);
      auVar9 = vpaddd_avx(auVar12,auVar9);
      auVar27 = ZEXT1664(auVar9);
      auVar12 = vpsrld_avx(auVar13,8);
      auVar12 = vpand_avx(auVar12,auVar24);
      auVar8 = vpaddd_avx(auVar8,auVar12);
      auVar25 = ZEXT1664(auVar8);
      auVar12 = vpsrld_avx(auVar13,0x10);
      auVar13 = vpsrld_avx(auVar13,0x18);
      auVar12 = vpand_avx(auVar12,auVar24);
      auVar10 = vpaddd_avx(auVar13,auVar10);
      auVar19 = ZEXT1664(auVar10);
      auVar11 = vpaddd_avx(auVar12,auVar11);
      auVar20 = ZEXT1664(auVar11);
    } while (uVar2 < uVar4);
    auVar24 = vpslld_avx(auVar9,4);
    auVar22 = vpslld_avx(auVar8,4);
    auVar23 = vpslld_avx(auVar11,4);
    auVar21 = vpslld_avx(auVar10,4);
  }
  auVar9 = vpunpckldq_avx(auVar24,auVar23);
  auVar9 = vpaddd_avx(auVar9,*(undefined1 (*) [16])flags);
  auVar23 = vpunpckhdq_avx(auVar24,auVar23);
  lVar3 = 0;
  *(undefined1 (*) [16])flags = auVar9;
  auVar23 = vpaddd_avx(auVar23,*(undefined1 (*) [16])(flags + 4));
  *(undefined1 (*) [16])(flags + 4) = auVar23;
  auVar23 = vpunpckldq_avx(auVar22,auVar21);
  auVar22 = vpunpckhdq_avx(auVar22,auVar21);
  auVar21 = vpaddd_avx(auVar23,*(undefined1 (*) [16])(flags + 8));
  *(undefined1 (*) [16])(flags + 8) = auVar21;
  auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
  auVar21 = vpaddd_avx(auVar22,*(undefined1 (*) [16])(flags + 0xc));
  *(undefined1 (*) [16])(flags + 0xc) = auVar21;
  auVar18 = vpmovsxbd_avx512f(_DAT_00116080);
  auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar3 = lVar3 + 1;
    auVar20 = vpbroadcastd_avx512f();
    auVar20 = vpsrlvd_avx512f(auVar20,auVar18);
    auVar20 = vpandd_avx512f(auVar20,auVar17);
    auVar19 = vpaddd_avx512f(auVar20,auVar19);
  } while (lVar3 != 8);
  auVar17 = vmovdqu64_avx512f(auVar19);
  *(undefined1 (*) [64])flags = auVar17;
  auVar17 = vpbroadcastd_avx512f(ZEXT416(2));
  lVar3 = 0;
  auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar3 = lVar3 + 1;
    auVar20 = vpbroadcastd_avx512f();
    auVar20 = vpsrlvd_avx512f(auVar20,auVar18);
    auVar20 = vpaddd_avx512f(auVar20,auVar20);
    auVar20 = vpandd_avx512f(auVar20,auVar17);
    auVar19 = vpaddd_avx512f(auVar20,auVar19);
  } while (lVar3 != 8);
  auVar17 = vmovdqu64_avx512f(auVar19);
  *(undefined1 (*) [64])flags = auVar17;
  auVar17 = vpbroadcastd_avx512f(ZEXT416(4));
  lVar3 = 0;
  auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar3 = lVar3 + 1;
    auVar20 = vpbroadcastd_avx512f();
    auVar20 = vpsrlvd_avx512f(auVar20,auVar18);
    auVar20 = vpslld_avx512f(auVar20,2);
    auVar20 = vpandd_avx512f(auVar20,auVar17);
    auVar19 = vpaddd_avx512f(auVar20,auVar19);
  } while (lVar3 != 8);
  auVar17 = vmovdqu64_avx512f(auVar19);
  *(undefined1 (*) [64])flags = auVar17;
  auVar17 = vpbroadcastd_avx512f(ZEXT416(8));
  lVar3 = 0;
  auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar3 = lVar3 + 1;
    auVar20 = vpbroadcastd_avx512f();
    auVar20 = vpsrlvd_avx512f(auVar20,auVar18);
    auVar20 = vpslld_avx512f(auVar20,3);
    auVar20 = vpandd_avx512f(auVar20,auVar17);
    auVar19 = vpaddd_avx512f(auVar20,auVar19);
  } while (lVar3 != 8);
  auVar17 = vmovdqu64_avx512f(auVar19);
  *(undefined1 (*) [64])flags = auVar17;
  return 0;
}

Assistant:

int pospopcnt_u16_sse_harley_seal_improved(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (16 * 8)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m128i* data = (const __m128i*)array;
    size_t size = len / 8;
    __m128i v1  = _mm_setzero_si128();
    __m128i v2  = _mm_setzero_si128();
    __m128i v4  = _mm_setzero_si128();
    __m128i v8  = _mm_setzero_si128();
    __m128i v16 = _mm_setzero_si128();
    __m128i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;
    uint16_t buffer[8];
    __m128i counter[4];
    for (size_t i = 0; i < 4; ++i) {
        counter[i] = _mm_setzero_si128();
    }

    while (i < limit) {

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define horizreduce(input, mask, shift, output) \
        __m128i output; \
        { \
            const __m128i tmp0 = _mm_and_si128(input, mask); \
            const __m128i tmp1 = _mm_and_si128(_mm_srli_epi32(input, shift), mask); \
            output = _mm_hadd_epi16(tmp0, tmp1); \
        }

            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  0), _mm_loadu_si128(data + i +  1));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  2), _mm_loadu_si128(data + i +  3));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  4), _mm_loadu_si128(data + i +  5));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  6), _mm_loadu_si128(data + i +  7));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  8),  _mm_loadu_si128(data + i +  9));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 10),  _mm_loadu_si128(data + i + 11));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i + 12),  _mm_loadu_si128(data + i + 13));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 14),  _mm_loadu_si128(data + i + 15));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsB,&v4, foursA, foursB);
            {
                horizreduce(v16, _mm_set1_epi8(0x55), 1, t0); // t0 = 2-bit counters
                horizreduce(t0,  _mm_set1_epi8(0x33), 2, t1); // t1 = 4-bit counters
                horizreduce(t1,  _mm_set1_epi8(0x0f), 4, t2); // t2 = 8-bit counters

                const __m128i mask_byte0 = _mm_set1_epi32(0x000000ff);
                counter[0] = _mm_add_epi32(counter[0], t2 & mask_byte0);
                counter[1] = _mm_add_epi32(counter[1], _mm_srli_epi32(t2, 1*8) & mask_byte0);
                counter[2] = _mm_add_epi32(counter[2], _mm_srli_epi32(t2, 2*8) & mask_byte0);
                counter[3] = _mm_add_epi32(counter[3], _mm_srli_epi32(t2, 3*8) & mask_byte0);
            }
            pospopcnt_csa_sse(&v16, &v8, eightsA, eightsB);
        } // for

        // update the counters after the last iteration
        {
            horizreduce(v16, _mm_set1_epi8(0x55), 1, t0);
            horizreduce(t0,  _mm_set1_epi8(0x33), 2, t1);
            horizreduce(t1,  _mm_set1_epi8(0x0f), 4, t2);

            const __m128i mask_byte0 = _mm_set1_epi32(0x000000ff);
            counter[0] = _mm_add_epi32(counter[0], t2 & mask_byte0);
            counter[1] = _mm_add_epi32(counter[1], _mm_srli_epi32(t2, 1*8) & mask_byte0);
            counter[2] = _mm_add_epi32(counter[2], _mm_srli_epi32(t2, 2*8) & mask_byte0);
            counter[3] = _mm_add_epi32(counter[3], _mm_srli_epi32(t2, 3*8) & mask_byte0);
        }
#undef horizreduce
    }

    counter[0] = _mm_slli_epi32(counter[0], 4); // * 16
    counter[1] = _mm_slli_epi32(counter[1], 4); // * 16
    counter[2] = _mm_slli_epi32(counter[2], 4); // * 16
    counter[3] = _mm_slli_epi32(counter[3], 4); // * 16

#if 0 // Left to illustrate the mapping between auxiliary counters and flags.
    flags[0] += _mm_extract_epi32(counter[0], 0);
    flags[1] += _mm_extract_epi32(counter[2], 0);
    flags[2] += _mm_extract_epi32(counter[0], 1);
    flags[3] += _mm_extract_epi32(counter[2], 1);
    flags[4] += _mm_extract_epi32(counter[0], 2);
    flags[5] += _mm_extract_epi32(counter[2], 2);
    flags[6] += _mm_extract_epi32(counter[0], 3);
    flags[7] += _mm_extract_epi32(counter[2], 3);

    flags[8]  += _mm_extract_epi32(counter[1], 0);
    flags[9]  += _mm_extract_epi32(counter[3], 0);
    flags[10] += _mm_extract_epi32(counter[1], 1);
    flags[11] += _mm_extract_epi32(counter[3], 1);
    flags[12] += _mm_extract_epi32(counter[1], 2);
    flags[13] += _mm_extract_epi32(counter[3], 2);
    flags[14] += _mm_extract_epi32(counter[1], 3);
    flags[15] += _mm_extract_epi32(counter[3], 3);
#else
#define update_flags(offset, counters)                  \
    {                                                   \
        __m128i* ptr = (__m128i*)(flags + offset);      \
        const __m128i f = _mm_loadu_si128(ptr);         \
        const __m128i s = _mm_add_epi32(f, counters);   \
        _mm_storeu_si128(ptr, s);                       \
    }
    update_flags(0  /*  0 ..  3 */, _mm_unpacklo_epi32(counter[0], counter[2]));
    update_flags(4  /*  4 ..  7 */, _mm_unpackhi_epi32(counter[0], counter[2]));
    update_flags(8  /*  8 .. 11 */, _mm_unpacklo_epi32(counter[1], counter[3]));
    update_flags(12 /* 12 .. 15 */, _mm_unpackhi_epi32(counter[1], counter[3]));
#undef update_flags
#endif

    _mm_storeu_si128((__m128i*)buffer, v1);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v2);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v4);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v8);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}